

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O0

uint64_t pow2ceil(uint64_t value)

{
  int iVar1;
  int n;
  uint64_t value_local;
  
  iVar1 = clz64(value - 1);
  if (iVar1 == 0) {
    value_local = (uint64_t)(int)(uint)((value != 0 ^ 0xffU) & 1);
  }
  else {
    value_local = 0x8000000000000000 >> ((char)iVar1 - 1U & 0x3f);
  }
  return value_local;
}

Assistant:

static inline uint64_t pow2ceil(uint64_t value)
{
    int n = clz64(value - 1);

    if (!n) {
        /*
         * @value - 1 has no leading zeroes, thus @value - 1 >= 2^63
         * Therefore, either @value == 0 or @value > 2^63.
         * If it's 0, return 1, else return 0.
         */
        return !value;
    }
    return 0x8000000000000000ull >> (n - 1);
}